

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ModportSubroutinePortListSyntax::ModportSubroutinePortListSyntax
          (ModportSubroutinePortListSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token importExport,
          SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *ports)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ModportPortSyntax *pMVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::ModportPortSyntax_*> local_30;
  
  uVar5 = importExport._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ModportSubroutinePortList,attributes);
  (this->importExport).kind = (short)uVar5;
  (this->importExport).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->importExport).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->importExport).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->importExport).info = importExport.info;
  SVar2 = (ports->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(ports->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent =
       (ports->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->ports).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->ports).super_SyntaxListBase.childCount = (ports->super_SyntaxListBase).childCount;
  (this->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473740;
  sVar1 = (ports->elements).size_;
  (this->ports).elements.data_ = (ports->elements).data_;
  (this->ports).elements.size_ = sVar1;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->ports).elements.size_;
  local_30.list = &this->ports;
  for (; (local_30.list != &this->ports || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pMVar4 = SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
             iterator_base<slang::syntax::ModportPortSyntax_*>::operator*(&local_30);
    (pMVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ModportSubroutinePortListSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token importExport, const SeparatedSyntaxList<ModportPortSyntax>& ports) :
        MemberSyntax(SyntaxKind::ModportSubroutinePortList, attributes), importExport(importExport), ports(ports) {
        this->ports.parent = this;
        for (auto child : this->ports)
            child->parent = this;
    }